

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O0

void init_module_example(void)

{
  class_<ExampleClass,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar1;
  class_<ExampleClass,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  local_10;
  
  boost::python::
  class_<ExampleClass,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::class_(&local_10,"ExampleClass",(char *)0x0);
  pcVar1 = (class_<ExampleClass,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<ExampleClass,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(ExampleClass::*)()>
                        ((class_<ExampleClass,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_10,"print",(first_type)ExampleClass::print_state);
  pcVar1 = (class_<ExampleClass,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<ExampleClass,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<_object*(*)(ExampleClass&)>(pcVar1,"exporter",example_class_export_wrap);
  pcVar1 = (class_<ExampleClass,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<ExampleClass,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(ExampleClass::*)(unsigned_char,unsigned_char,unsigned_char)>
                        (pcVar1,"set_data",(first_type)ExampleClass::set_data);
  boost::python::
  class_<ExampleClass,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(*)(ExampleClass&,boost::python::api::object)>
            (pcVar1,"importer",example_class_import_wrap);
  boost::python::
  class_<ExampleClass,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::~class_(&local_10);
  return;
}

Assistant:

BOOST_PYTHON_MODULE(example)
{
  namespace python = boost::python;
  python::class_<ExampleClass>("ExampleClass")
    .def("print", &ExampleClass::print_state)
    .def("exporter", &example_class_export_wrap)
    .def("set_data", &ExampleClass::set_data)
    .def("importer", &example_class_import_wrap)
    ;
}